

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptorProto::Swap
          (ServiceDescriptorProto *this,ServiceDescriptorProto *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  ServiceOptions *pSVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  
  if (other != this) {
    psVar3 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar3;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->method_).super_RepeatedPtrFieldBase,
               &(other->method_).super_RepeatedPtrFieldBase);
    pSVar4 = this->options_;
    this->options_ = other->options_;
    other->options_ = pSVar4;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void ServiceDescriptorProto::Swap(ServiceDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    method_.Swap(&other->method_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}